

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# issue-25-default-values.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  ostream *poVar5;
  int iVar6;
  char *pcVar7;
  json person_emtpy_address;
  json_validator validator;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  json default_patch;
  json person_missing_address;
  _Any_data local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  _Any_data local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  _Any_data local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78 = 0;
  uStack_70 = 0;
  nlohmann::json_schema::json_validator::json_validator
            (&validator,(schema_loader *)&local_48,(format_checker *)&local_68,
             (content_checker *)&local_88);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  nlohmann::json_schema::json_validator::set_root_schema(&validator,&person_schema_abi_cxx11_);
  nlohmann::json_abi_v3_11_2::literals::json_literals::operator____json_abi_cxx11_
            ((json_literals *)&person_emtpy_address,
             "{\n\t\t\"name\": \"Hans\",\n\t\t\"age\": 69,\n\t\t\"address\": {}\n\t\t}",0x34);
  nlohmann::json_schema::json_validator::validate
            ((json_validator *)&default_patch,(json *)&validator);
  if (default_patch.m_type == array) {
    sVar2 = nlohmann::json_abi_v3_11_2::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::size(&default_patch);
    if (sVar2 != 1) {
      pcVar7 = "Patch with defaults is expected to contain one opperation";
      goto LAB_00107a5d;
    }
    pvVar3 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator[](&default_patch,0);
    bVar1 = nlohmann::json_abi_v3_11_2::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::contains<const_char_(&)[3],_0>(pvVar3,(char (*) [3])"op");
    if (bVar1) {
      pvVar4 = nlohmann::json_abi_v3_11_2::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)pvVar3,"op");
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_d8,pvVar4);
      bVar1 = std::operator!=(&local_d8,"add");
      std::__cxx11::string::~string((string *)&local_d8);
      if (bVar1) {
        pcVar7 = "Patch with defaults is expected to contain add opperation";
        goto LAB_00107a7a;
      }
      bVar1 = nlohmann::json_abi_v3_11_2::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::contains<const_char_(&)[5],_0>(pvVar3,(char (*) [5])0x133bb7);
      if (!bVar1) {
        pcVar7 = "Patch with defaults is expected to contain a path";
        goto LAB_00107a7a;
      }
      pvVar4 = nlohmann::json_abi_v3_11_2::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)pvVar3,"path");
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_d8,pvVar4);
      pcVar7 = "/address/street";
      bVar1 = std::operator!=(&local_d8,"/address/street");
      if (bVar1) {
        poVar5 = std::operator<<((ostream *)&std::cerr,
                                 "Patch with defaults contains wrong path. It is ");
        poVar5 = std::operator<<(poVar5,(string *)&local_d8);
        poVar5 = std::operator<<(poVar5," and should be ");
      }
      else {
        bVar1 = nlohmann::json_abi_v3_11_2::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::contains<const_char_(&)[6],_0>(pvVar3,(char (*) [6])0x133c39);
        poVar5 = (ostream *)&std::cerr;
        if (bVar1) {
          pvVar3 = nlohmann::json_abi_v3_11_2::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)pvVar3,"value");
          nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&person_missing_address,pvVar3);
          bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&person_missing_address,"Abbey Road");
          std::__cxx11::string::~string((string *)&person_missing_address);
          if (!bVar1) {
            std::__cxx11::string::~string((string *)&local_d8);
            nlohmann::json_abi_v3_11_2::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json(&default_patch);
            nlohmann::json_abi_v3_11_2::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json(&person_emtpy_address);
            nlohmann::json_abi_v3_11_2::literals::json_literals::operator____json_abi_cxx11_
                      ((json_literals *)&person_missing_address,
                       "{\n\t\t\"name\": \"Hans\",\n\t\t\"age\": 69\n\t\t}",0x23);
            nlohmann::json_schema::json_validator::validate
                      ((json_validator *)&person_emtpy_address,(json *)&validator);
            if (person_emtpy_address.m_type == array) {
              sVar2 = nlohmann::json_abi_v3_11_2::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::size(&person_emtpy_address);
              if (sVar2 != 1) {
                pcVar7 = "Patch with defaults is expected to contain one opperation";
                goto LAB_00107ca5;
              }
              pvVar3 = nlohmann::json_abi_v3_11_2::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       ::operator[](&person_emtpy_address,0);
              bVar1 = nlohmann::json_abi_v3_11_2::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::contains<const_char_(&)[3],_0>(pvVar3,(char (*) [3])"op");
              if (!bVar1) {
                pcVar7 = "Patch with defaults is expected to contain opperation entry";
LAB_00107cc2:
                poVar5 = std::operator<<((ostream *)&std::cerr,pcVar7);
                std::endl<char,std::char_traits<char>>(poVar5);
                goto LAB_00107cd6;
              }
              pvVar4 = nlohmann::json_abi_v3_11_2::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                   *)pvVar3,"op");
              nlohmann::json_abi_v3_11_2::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_d8,pvVar4);
              bVar1 = std::operator!=(&local_d8,"add");
              std::__cxx11::string::~string((string *)&local_d8);
              if (bVar1) {
                pcVar7 = "Patch with defaults is expected to contain add opperation";
                goto LAB_00107cc2;
              }
              bVar1 = nlohmann::json_abi_v3_11_2::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::contains<const_char_(&)[5],_0>(pvVar3,(char (*) [5])0x133bb7);
              if (!bVar1) {
                pcVar7 = "Patch with defaults is expected to contain a path";
                goto LAB_00107cc2;
              }
              pvVar4 = nlohmann::json_abi_v3_11_2::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                   *)pvVar3,"path");
              nlohmann::json_abi_v3_11_2::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_d8,pvVar4);
              pcVar7 = "/address";
              bVar1 = std::operator!=(&local_d8,"/address");
              if (bVar1) {
                poVar5 = std::operator<<((ostream *)&std::cerr,
                                         "Patch with defaults contains wrong path. It is ");
                poVar5 = std::operator<<(poVar5,(string *)&local_d8);
                poVar5 = std::operator<<(poVar5," and should be ");
LAB_00107dd4:
                poVar5 = std::operator<<(poVar5,pcVar7);
                std::endl<char,std::char_traits<char>>(poVar5);
                iVar6 = 1;
              }
              else {
                bVar1 = nlohmann::json_abi_v3_11_2::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::contains<const_char_(&)[6],_0>(pvVar3,(char (*) [6])0x133c39);
                poVar5 = (ostream *)&std::cerr;
                if (!bVar1) {
                  pcVar7 = "Patch with defaults is expected to contain a value";
                  goto LAB_00107dd4;
                }
                pvVar4 = nlohmann::json_abi_v3_11_2::
                         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         ::operator[]<char_const>
                                   ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                     *)pvVar3,"value");
                pcVar7 = "Patch with defaults contains wrong value";
                if (pvVar4->m_type != object) goto LAB_00107dd4;
                pvVar3 = nlohmann::json_abi_v3_11_2::
                         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         ::operator[]<char_const>
                                   ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                     *)pvVar3,"value");
                bVar1 = nlohmann::json_abi_v3_11_2::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::empty(pvVar3);
                iVar6 = 0;
                if (!bVar1) goto LAB_00107dd4;
              }
              std::__cxx11::string::~string((string *)&local_d8);
            }
            else {
              pcVar7 = "Patch with defaults is expected to be an array";
LAB_00107ca5:
              poVar5 = std::operator<<((ostream *)&std::cerr,pcVar7);
              std::endl<char,std::char_traits<char>>(poVar5);
LAB_00107cd6:
              iVar6 = 1;
            }
            nlohmann::json_abi_v3_11_2::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json(&person_emtpy_address);
            nlohmann::json_abi_v3_11_2::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json(&person_missing_address);
            goto LAB_00107aa5;
          }
          pcVar7 = "Patch with defaults contains wrong value";
        }
        else {
          pcVar7 = "Patch with defaults is expected to contain a value";
        }
      }
      poVar5 = std::operator<<(poVar5,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    else {
      pcVar7 = "Patch with defaults is expected to contain opperation entry";
LAB_00107a7a:
      poVar5 = std::operator<<((ostream *)&std::cerr,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
  }
  else {
    pcVar7 = "Patch with defaults is expected to be an array";
LAB_00107a5d:
    poVar5 = std::operator<<((ostream *)&std::cerr,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&default_patch);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&person_emtpy_address);
  iVar6 = 1;
LAB_00107aa5:
  nlohmann::json_schema::json_validator::~json_validator(&validator);
  return iVar6;
}

Assistant:

int main(void)
{
	json_validator validator{};
	validator.set_root_schema(person_schema);

	{
		// add address which is optional that should generate a diff containing a default street
		json person_emtpy_address = R"({
		"name": "Hans",
		"age": 69,
		"address": {}
		})"_json;

		const auto default_patch = validator.validate(person_emtpy_address);

		if (!default_patch.is_array()) {
			std::cerr << "Patch with defaults is expected to be an array" << std::endl;
			return 1;
		}

		if (default_patch.size() != 1) {
			std::cerr << "Patch with defaults is expected to contain one opperation" << std::endl;
			return 1;
		}

		const auto &single_op = default_patch[0];

		if (!single_op.contains("op")) {
			std::cerr << "Patch with defaults is expected to contain opperation entry" << std::endl;
			return 1;
		}

		if (single_op["op"].get<std::string>() != "add") {
			std::cerr << "Patch with defaults is expected to contain add opperation" << std::endl;
			return 1;
		}

		if (!single_op.contains("path")) {
			std::cerr << "Patch with defaults is expected to contain a path" << std::endl;
			return 1;
		}

		const auto &readPath = single_op["path"].get<std::string>();
		if (readPath != "/address/street") {
			std::cerr << "Patch with defaults contains wrong path. It is " << readPath << " and should be "
			          << "/address/street" << std::endl;
			return 1;
		}

		if (!single_op.contains("value")) {
			std::cerr << "Patch with defaults is expected to contain a value" << std::endl;
			return 1;
		}

		if (single_op["value"].get<std::string>() != "Abbey Road") {
			std::cerr << "Patch with defaults contains wrong value" << std::endl;
			return 1;
		}
	}
	{
		// add address which is optional that should generate a diff containing a empty object
		// but not work address which is null or other address which has no default
		json person_missing_address = R"({
		"name": "Hans",
		"age": 69
		})"_json;

		const auto default_patch = validator.validate(person_missing_address);

		if (!default_patch.is_array()) {
			std::cerr << "Patch with defaults is expected to be an array" << std::endl;
			return 1;
		}

		if (default_patch.size() != 1) {
			std::cerr << "Patch with defaults is expected to contain one opperation" << std::endl;
			return 1;
		}

		const auto &single_op = default_patch[0];

		if (!single_op.contains("op")) {
			std::cerr << "Patch with defaults is expected to contain opperation entry" << std::endl;
			return 1;
		}

		if (single_op["op"].get<std::string>() != "add") {
			std::cerr << "Patch with defaults is expected to contain add opperation" << std::endl;
			return 1;
		}

		if (!single_op.contains("path")) {
			std::cerr << "Patch with defaults is expected to contain a path" << std::endl;
			return 1;
		}

		const auto &readPath = single_op["path"].get<std::string>();
		if (readPath != "/address") {
			std::cerr << "Patch with defaults contains wrong path. It is " << readPath << " and should be "
			          << "/address" << std::endl;
			return 1;
		}

		if (!single_op.contains("value")) {
			std::cerr << "Patch with defaults is expected to contain a value" << std::endl;
			return 1;
		}

		if (!single_op["value"].is_object() || !single_op["value"].empty()) {
			std::cerr << "Patch with defaults contains wrong value" << std::endl;
			return 1;
		}
	}
	return 0;
}